

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O2

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SetBase(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          *this)

{
  Ch *pCVar1;
  SizeType SVar2;
  SizeType SVar3;
  Ch *pCVar4;
  
  pCVar4 = this->base_;
  pCVar1 = this->scheme_;
  SVar2 = GetSchemeStringLength(this);
  memcpy(pCVar4,pCVar1,(ulong)SVar2);
  SVar2 = GetSchemeStringLength(this);
  pCVar4 = pCVar4 + SVar2;
  pCVar1 = this->auth_;
  SVar2 = GetAuthStringLength(this);
  memcpy(pCVar4,pCVar1,(ulong)SVar2);
  SVar2 = GetAuthStringLength(this);
  pCVar4 = pCVar4 + SVar2;
  pCVar1 = this->path_;
  SVar2 = GetPathStringLength(this);
  memcpy(pCVar4,pCVar1,(ulong)SVar2);
  SVar2 = GetPathStringLength(this);
  pCVar1 = this->query_;
  SVar3 = GetQueryStringLength(this);
  memcpy(pCVar4 + SVar2,pCVar1,(ulong)SVar3);
  SVar3 = GetQueryStringLength(this);
  (pCVar4 + SVar2)[SVar3] = '\0';
  return;
}

Assistant:

void SetBase() {
        Ch* next = base_;
        std::memcpy(next, scheme_, GetSchemeStringLength() * sizeof(Ch));
        next+= GetSchemeStringLength();
        std::memcpy(next, auth_, GetAuthStringLength() * sizeof(Ch));
        next+= GetAuthStringLength();
        std::memcpy(next, path_, GetPathStringLength() * sizeof(Ch));
        next+= GetPathStringLength();
        std::memcpy(next, query_, GetQueryStringLength() * sizeof(Ch));
        next+= GetQueryStringLength();
        *next = '\0';
    }